

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

int Abc_SuppGenFindBest(Vec_Wrd_t *p,int nBits,int *pMerit)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int Counts [64];
  
  iVar3 = 0;
  memset(Counts,0,0x100);
  Abc_SuppGenProfile(p,nBits,Counts);
  for (lVar2 = 1; lVar2 < nBits; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2;
    if (Counts[lVar2] <= Counts[iVar3]) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
  }
  *pMerit = Counts[iVar3];
  return iVar3;
}

Assistant:

int Abc_SuppGenFindBest( Vec_Wrd_t * p, int nBits, int * pMerit )
{
    int k, kBest = 0, Counts[64] = {0};
    Abc_SuppGenProfile( p, nBits, Counts );
    for ( k = 1; k < nBits; k++ )
        if ( Counts[kBest] < Counts[k] )
            kBest = k;
    *pMerit = Counts[kBest];
    return kBest;
}